

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.h
# Opt level: O2

void __thiscall
xemmai::t_value<xemmai::t_slot>::f_call
          (t_value<xemmai::t_slot> *this,t_object *a_key,size_t *a_index,t_pvalue *a_stack,
          size_t a_n)

{
  __pointer_type ptVar1;
  t_type **pptVar2;
  long in_FS_OFFSET;
  t_pvalue local_10;
  
  ptVar1 = (this->super_t_slot).v_p._M_b._M_p;
  pptVar2 = (t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0x10 + (long)ptVar1 * 8);
  if ((__pointer_type)0x4 < ptVar1) {
    pptVar2 = &ptVar1->v_type;
  }
  local_10.super_t_pointer.v_p = (this->super_t_slot).v_p._M_b._M_p;
  local_10.field_0 = *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)&this->field_0;
  t_type_of<xemmai::t_object>::f_invoke(*pptVar2,&local_10,a_key,a_index,a_stack,a_n);
  return;
}

Assistant:

XEMMAI__PORTABLE__ALWAYS_INLINE inline void t_value<T_tag>::f_call(t_object* a_key, size_t& a_index, t_pvalue* a_stack, size_t a_n) const
{
	f_type()->f_invoke(*this, a_key, a_index, a_stack, a_n);
}